

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O1

void __thiscall ExampleAppConsole::~ExampleAppConsole(ExampleAppConsole *this)

{
  ImGuiTextRange *ptr;
  char **ppcVar1;
  long lVar2;
  
  ClearLog(this);
  if (0 < (this->History).Size) {
    lVar2 = 0;
    do {
      free((this->History).Data[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->History).Size);
  }
  ptr = (this->Filter).Filters.Data;
  if (ptr != (ImGuiTextRange *)0x0) {
    ImGui::MemFree(ptr);
  }
  ppcVar1 = (this->History).Data;
  if (ppcVar1 != (char **)0x0) {
    ImGui::MemFree(ppcVar1);
  }
  ppcVar1 = (this->Commands).Data;
  if (ppcVar1 != (char **)0x0) {
    ImGui::MemFree(ppcVar1);
  }
  ppcVar1 = (this->Items).Data;
  if (ppcVar1 != (char **)0x0) {
    ImGui::MemFree(ppcVar1);
  }
  return;
}

Assistant:

~ExampleAppConsole()
    {
        ClearLog();
        for (int i = 0; i < History.Size; i++)
            free(History[i]);
    }